

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Minefield_Data_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Data_PDU *this)

{
  ushort *puVar1;
  pointer pMVar2;
  ostream *poVar3;
  ostream *poVar4;
  ulong uVar5;
  ushort *puVar6;
  char cVar7;
  pointer pMVar8;
  KString local_3e0;
  KString local_3c0;
  string local_3a0 [32];
  KString local_380;
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar3 = std::operator<<(local_1a8,(string *)&local_360);
  poVar3 = std::operator<<(poVar3,"-Minefield Data PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_380,&this->super_Minefield_Header);
  poVar3 = std::operator<<(poVar3,(string *)&local_380);
  poVar4 = std::operator<<(poVar3,"Requesting ID: ");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3e0,&this->m_ReqID);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar3 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar3,'\t');
  uVar5 = 0;
  while( true ) {
    uVar5 = uVar5 & 0xffff;
    if (local_3e0._M_string_length <= uVar5) break;
    cVar7 = local_3e0._M_dataplus._M_p[uVar5];
    if (local_3e0._M_string_length - 1 != uVar5 && cVar7 == '\n') {
      cVar7 = '\t';
      std::operator<<(poVar3,'\n');
    }
    std::operator<<(poVar3,cVar7);
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar3 = std::operator<<(poVar4,local_3a0);
  poVar3 = std::operator<<(poVar3,"Minefield Sequence Number: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_SeqNumUnion).m_ui16SeqNum);
  poVar3 = std::operator<<(poVar3,"Request ID: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8ReqID);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"PDU Sequence Number: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8PduSeqNum);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Of PDU\'s: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumPdus);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Of Mines: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumMines);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Of Sensor Types: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumSensTyp);
  poVar3 = std::operator<<(poVar3,"\n");
  DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_((KString *)local_340,&this->m_DataFilter);
  poVar3 = std::operator<<(poVar3,(string *)local_340);
  poVar3 = std::operator<<(poVar3,"Mine Type: ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_3c0,&this->m_MineTyp);
  poVar3 = std::operator<<(poVar3,(string *)&local_3c0);
  std::operator<<(poVar3,"Sensor Types:\n");
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_360);
  puVar1 = (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar6 = (this->m_vui16SensorTypes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    poVar3 = std::operator<<(local_1a8,"\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar6);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(local_1a8,"Mines:\n");
  pMVar2 = (this->m_vMines).
           super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pMVar8 = (this->m_vMines).
                super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar8 != pMVar2; pMVar8 = pMVar8 + 1) {
    (*(pMVar8->super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase[2])
              ((string *)local_340,pMVar8);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Data PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting ID: "             << IndentString( m_ReqID.GetAsString(), 1 )
       << "Minefield Sequence Number: " << m_SeqNumUnion.m_ui16SeqNum
       << "Request ID: "                << ( KUINT16 )m_ui8ReqID        << "\n"
       << "PDU Sequence Number: "       << ( KUINT16 )m_ui8PduSeqNum    << "\n"
       << "Number Of PDU's: "           << ( KUINT16 )m_ui8NumPdus      << "\n"
       << "Number Of Mines: "           << ( KUINT16 )m_ui8NumMines     << "\n"
       << "Number Of Sensor Types: "    << ( KUINT16 )m_ui8NumSensTyp   << "\n"
       << m_DataFilter.GetAsString()
       << "Mine Type: " << m_MineTyp.GetAsString()
       << "Sensor Types:\n";

    // Sensor Types
    vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    vector<KUINT16>::const_iterator citrStEnd = m_vui16SensorTypes.end();
    for( ; citrSt != citrStEnd; ++citrSt )
    {
        ss <<  "\t" << *citrSt << "\n";
    }

    ss << "Mines:\n";

    vector<Mine>::const_iterator citrMn = m_vMines.begin();
    vector<Mine>::const_iterator citrMnEnd = m_vMines.end();
    for( ; citrMn != citrMnEnd; ++citrMn )
    {
        ss << citrMn->GetAsString();
    }

    return ss.str();
}